

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  FieldDescriptor *this_00;
  Descriptor *pDVar1;
  string_view text;
  
  this_00 = this->descriptor_;
  if ((this_00->options_->field_0)._impl_.deprecated_ != false) {
LAB_00e587f9:
    text._M_str = "[global::System.ObsoleteAttribute]\n";
    text._M_len = 0x23;
    io::Printer::Print<>(printer,text);
    return;
  }
  if (this_00->type_ == '\v') {
    pDVar1 = FieldDescriptor::message_type(this_00);
    if ((pDVar1->options_->field_0)._impl_.deprecated_ == true) goto LAB_00e587f9;
  }
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}